

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O1

LY_ERR searchpath_strcat(char **searchpaths,char *path)

{
  size_t sVar1;
  size_t sVar2;
  char *pcVar3;
  
  pcVar3 = *searchpaths;
  if (pcVar3 == (char *)0x0) {
    pcVar3 = strdup(path);
  }
  else {
    sVar1 = strlen(pcVar3);
    sVar2 = strlen(path);
    pcVar3 = (char *)realloc(pcVar3,sVar1 + sVar2 + 2);
    if (pcVar3 == (char *)0x0) {
      return LY_EMEM;
    }
    sVar1 = strlen(pcVar3);
    (pcVar3 + sVar1)[0] = ':';
    (pcVar3 + sVar1)[1] = '\0';
    strcat(pcVar3,path);
  }
  *searchpaths = pcVar3;
  return LY_SUCCESS;
}

Assistant:

LY_ERR
searchpath_strcat(char **searchpaths, const char *path)
{
    uint64_t len;
    char *new;

    if (!(*searchpaths)) {
        *searchpaths = strdup(path);
        return LY_SUCCESS;
    }

    len = strlen(*searchpaths) + strlen(path) + strlen(PATH_SEPARATOR);
    new = realloc(*searchpaths, sizeof(char) * len + 1);
    if (!new) {
        return LY_EMEM;
    }
    strcat(new, PATH_SEPARATOR);
    strcat(new, path);
    *searchpaths = new;

    return LY_SUCCESS;
}